

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O1

void __thiscall mognetwork::Packet::~Packet(Packet *this)

{
  ~Packet(this);
  operator_delete(this);
  return;
}

Assistant:

Packet::~Packet()
  {
    if (m_dataPack != NULL)
      delete m_dataPack;
    else if (m_data != NULL)
      delete m_data;
  }